

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O1

int amqpvalue_encode_array_item
              (AMQP_VALUE item,_Bool first_element,AMQPVALUE_ENCODER_OUTPUT encoder_output,
              void *context)

{
  AMQP_VALUE pAVar1;
  int iVar2;
  int iVar3;
  LOGGER_LOG p_Var4;
  size_t sVar5;
  char *pcVar6;
  uint32_t array_size;
  uint32_t map_size;
  uint32_t list_size;
  
  if (item == (AMQP_VALUE)0x0 || encoder_output == (AMQPVALUE_ENCODER_OUTPUT)0x0) {
    p_Var4 = xlogging_get_log_function();
    iVar3 = 0x11a8;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x11a8;
    }
    pcVar6 = "Bad arguments: item = %p, encoder_output = %p";
    iVar2 = 0x11a7;
LAB_0014b5e9:
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
              ,"amqpvalue_encode_array_item",iVar2,1,pcVar6,item);
  }
  else {
    switch(item->type) {
    case AMQP_TYPE_NULL:
      if ((first_element) && (iVar2 = encode_null_constructor(encoder_output,context), iVar2 != 0))
      {
        return 0x11b8;
      }
      iVar3 = 0;
      break;
    case AMQP_TYPE_BOOL:
      if ((first_element) &&
         (iVar2 = encode_boolean_constructor(encoder_output,context), iVar2 != 0)) {
        return 0x11c1;
      }
      iVar2 = encode_boolean_value(encoder_output,context,(item->value).bool_value);
      return iVar2;
    case AMQP_TYPE_UBYTE:
      if ((first_element) && (iVar2 = encode_ubyte_constructor(encoder_output,context), iVar2 != 0))
      {
        return 0x11ca;
      }
      iVar2 = encode_ubyte_value(encoder_output,context,(item->value).ubyte_value);
      return iVar2;
    case AMQP_TYPE_USHORT:
      if ((first_element) && (iVar2 = encode_ushort_constructor(encoder_output,context), iVar2 != 0)
         ) {
        return 0x11d3;
      }
      iVar2 = encode_ushort_value(encoder_output,context,(item->value).ushort_value);
      return iVar2;
    case AMQP_TYPE_UINT:
      if ((first_element) &&
         (iVar2 = encode_uint_constructor(encoder_output,context,false), iVar2 != 0)) {
        return 0x11dc;
      }
      iVar2 = encode_uint_value(encoder_output,context,(item->value).uint_value,false);
      return iVar2;
    case AMQP_TYPE_ULONG:
      if ((first_element) &&
         (iVar2 = encode_ulong_constructor(encoder_output,context,false), iVar2 != 0)) {
        return 0x11e5;
      }
      iVar2 = encode_ulong_value(encoder_output,context,(item->value).ulong_value,false);
      return iVar2;
    case AMQP_TYPE_BYTE:
      if ((first_element) && (iVar2 = encode_byte_constructor(encoder_output,context), iVar2 != 0))
      {
        return 0x11ee;
      }
      iVar2 = encode_byte_value(encoder_output,context,(item->value).byte_value);
      return iVar2;
    case AMQP_TYPE_SHORT:
      if ((first_element) && (iVar2 = encode_short_constructor(encoder_output,context), iVar2 != 0))
      {
        return 0x11f7;
      }
      iVar2 = encode_short_value(encoder_output,context,(item->value).short_value);
      return iVar2;
    case AMQP_TYPE_INT:
      if ((first_element) &&
         (iVar2 = encode_int_constructor(encoder_output,context,false), iVar2 != 0)) {
        return 0x1200;
      }
      iVar2 = encode_int_value(encoder_output,context,(item->value).int_value,false);
      return iVar2;
    case AMQP_TYPE_LONG:
      if ((first_element) &&
         (iVar2 = encode_long_constructor(encoder_output,context,false), iVar2 != 0)) {
        return 0x1209;
      }
      iVar2 = encode_long_value(encoder_output,context,(item->value).long_value,false);
      return iVar2;
    case AMQP_TYPE_FLOAT:
      if ((first_element) && (iVar2 = encode_float_constructor(encoder_output,context), iVar2 != 0))
      {
        return 0x1212;
      }
      iVar2 = encode_float_value(encoder_output,context,(item->value).float_value);
      return iVar2;
    case AMQP_TYPE_DOUBLE:
      if ((first_element) && (iVar2 = encode_double_constructor(encoder_output,context), iVar2 != 0)
         ) {
        return 0x121b;
      }
      iVar2 = encode_double_value(encoder_output,context,(item->value).double_value);
      return iVar2;
    default:
      p_Var4 = xlogging_get_log_function();
      iVar3 = 0x11b2;
      if (p_Var4 == (LOGGER_LOG)0x0) {
        return 0x11b2;
      }
      item = (AMQP_VALUE)(ulong)item->type;
      pcVar6 = "Unsupported array type: %d";
      iVar2 = 0x11b1;
      goto LAB_0014b5e9;
    case AMQP_TYPE_TIMESTAMP:
      if ((first_element) &&
         (iVar2 = encode_timestamp_constructor(encoder_output,context), iVar2 != 0)) {
        return 0x1224;
      }
      iVar2 = encode_timestamp_value(encoder_output,context,(item->value).long_value);
      return iVar2;
    case AMQP_TYPE_UUID:
      if ((first_element) && (iVar2 = encode_uuid_constructor(encoder_output,context), iVar2 != 0))
      {
        return 0x122d;
      }
      iVar2 = encode_uuid_value(encoder_output,context,&(item->value).ubyte_value);
      return iVar2;
    case AMQP_TYPE_BINARY:
      if ((first_element) &&
         (iVar2 = encode_binary_constructor(encoder_output,context,false), iVar2 != 0)) {
        return 0x1236;
      }
      iVar2 = encode_binary_value(encoder_output,context,
                                  (uchar *)(item->value).described_value.descriptor,
                                  (item->value).binary_value.length,false);
      return iVar2;
    case AMQP_TYPE_STRING:
      if ((first_element) &&
         (iVar2 = encode_string_constructor(encoder_output,context,false), iVar2 != 0)) {
        return 0x123f;
      }
      pAVar1 = (item->value).described_value.descriptor;
      sVar5 = strlen((char *)pAVar1);
      iVar2 = encode_string_value(encoder_output,context,(char *)pAVar1,sVar5,false);
      return iVar2;
    case AMQP_TYPE_SYMBOL:
      if ((first_element) &&
         (iVar2 = encode_symbol_constructor(encoder_output,context,false), iVar2 != 0)) {
        return 0x1248;
      }
      pAVar1 = (item->value).described_value.descriptor;
      sVar5 = strlen((char *)pAVar1);
      iVar2 = encode_symbol_value(encoder_output,context,(char *)pAVar1,sVar5,false);
      return iVar2;
    case AMQP_TYPE_LIST:
      if ((first_element) &&
         (iVar2 = encode_list_constructor(encoder_output,context,false), iVar2 != 0)) {
        return 0x1254;
      }
      iVar2 = amqpvalue_get_encoded_list_size
                        ((item->value).list_value.items,(item->value).binary_value.length,&list_size
                        );
      iVar3 = 0x1258;
      if (iVar2 == 0) {
        iVar3 = encode_list_value(encoder_output,context,(item->value).binary_value.length,list_size
                                  ,(item->value).list_value.items,false);
      }
      break;
    case AMQP_TYPE_MAP:
      if ((first_element) &&
         (iVar2 = encode_map_constructor(encoder_output,context,false), iVar2 != 0)) {
        return 0x1267;
      }
      iVar2 = amqpvalue_get_encoded_map_size
                        ((item->value).map_value.pairs,(item->value).binary_value.length,&map_size);
      iVar3 = 0x126b;
      if (iVar2 == 0) {
        iVar3 = encode_map_value(encoder_output,context,(item->value).binary_value.length,map_size,
                                 (item->value).map_value.pairs,false);
      }
      break;
    case AMQP_TYPE_ARRAY:
      if ((first_element) &&
         (iVar2 = encode_array_constructor(encoder_output,context,false), iVar2 != 0)) {
        return 0x127a;
      }
      iVar2 = amqpvalue_get_encoded_array_size
                        ((item->value).list_value.items,(item->value).binary_value.length,
                         &array_size);
      iVar3 = 0x127e;
      if (iVar2 == 0) {
        iVar3 = encode_array_value(encoder_output,context,(item->value).binary_value.length,
                                   array_size,(item->value).list_value.items,false);
      }
    }
  }
  return iVar3;
}

Assistant:

static int amqpvalue_encode_array_item(AMQP_VALUE item, bool first_element, AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context)
{
    int result;

    if ((item == NULL) ||
        (encoder_output == NULL))
    {
        LogError("Bad arguments: item = %p, encoder_output = %p", item, encoder_output);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)item;

        switch (value_data->type)
        {
            default:
                LogError("Unsupported array type: %d", (int)value_data->type);
                result = MU_FAILURE;
                break;

            case AMQP_TYPE_NULL:
                if ((first_element) && (encode_null_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_null_value(encoder_output, context);
                break;

            case AMQP_TYPE_BOOL:
                if ((first_element) && (encode_boolean_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_boolean_value(encoder_output, context, value_data->value.bool_value);
                break;

            case AMQP_TYPE_UBYTE:
                if ((first_element) && (encode_ubyte_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_ubyte_value(encoder_output, context, value_data->value.ubyte_value);
                break;

            case AMQP_TYPE_USHORT:
                if ((first_element) && (encode_ushort_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_ushort_value(encoder_output, context, value_data->value.ushort_value);
                break;

            case AMQP_TYPE_UINT:
                if ((first_element) && (encode_uint_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_uint_value(encoder_output, context, value_data->value.uint_value, false);
                break;

            case AMQP_TYPE_ULONG:
                if ((first_element) && (encode_ulong_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_ulong_value(encoder_output, context, value_data->value.ulong_value, false);
                break;

            case AMQP_TYPE_BYTE:
                if ((first_element) && (encode_byte_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_byte_value(encoder_output, context, value_data->value.byte_value);
                break;

            case AMQP_TYPE_SHORT:
                if ((first_element) && (encode_short_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_short_value(encoder_output, context, value_data->value.short_value);
                break;

            case AMQP_TYPE_INT:
                if ((first_element) && (encode_int_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_int_value(encoder_output, context, value_data->value.int_value, false);
                break;

            case AMQP_TYPE_LONG:
                if ((first_element) && (encode_long_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_long_value(encoder_output, context, value_data->value.long_value, false);
                break;

            case AMQP_TYPE_FLOAT:
                if ((first_element) && (encode_float_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_float_value(encoder_output, context, value_data->value.float_value);
                break;

            case AMQP_TYPE_DOUBLE:
                if ((first_element) && (encode_double_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_double_value(encoder_output, context, value_data->value.double_value);
                break;

            case AMQP_TYPE_TIMESTAMP:
                if ((first_element) && (encode_timestamp_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_timestamp_value(encoder_output, context, value_data->value.timestamp_value);
                break;

            case AMQP_TYPE_UUID:
                if ((first_element) && (encode_uuid_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_uuid_value(encoder_output, context, value_data->value.uuid_value);
                break;

            case AMQP_TYPE_BINARY:
                if ((first_element) && (encode_binary_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_binary_value(encoder_output, context, (const unsigned char*)value_data->value.binary_value.bytes, value_data->value.binary_value.length, false);
                break;

            case AMQP_TYPE_STRING:
                if ((first_element) && (encode_string_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_string_value(encoder_output, context, value_data->value.string_value.chars, strlen(value_data->value.string_value.chars), false);
                break;

            case AMQP_TYPE_SYMBOL:
                if ((first_element) && (encode_symbol_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_symbol_value(encoder_output, context, value_data->value.symbol_value.chars, strlen(value_data->value.symbol_value.chars), false);
                break;

            case AMQP_TYPE_LIST:
            {
                uint32_t list_size;

                if ((first_element) && (encode_list_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                }
                else if (amqpvalue_get_encoded_list_size(value_data->value.list_value.items, value_data->value.list_value.count, &list_size) != 0)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    result = encode_list_value(encoder_output, context, value_data->value.list_value.count, list_size, value_data->value.list_value.items, false);
                }
                break;
            }

            case AMQP_TYPE_MAP:
            {
                uint32_t map_size;

                if ((first_element) && (encode_map_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                }
                else if (amqpvalue_get_encoded_map_size(value_data->value.map_value.pairs, value_data->value.map_value.pair_count, &map_size) != 0)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    result = encode_map_value(encoder_output, context, value_data->value.map_value.pair_count, map_size, value_data->value.map_value.pairs, false);
                }
                break;
            }

            case AMQP_TYPE_ARRAY:
            {
                uint32_t array_size;

                if ((first_element) && (encode_array_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                }
                else if (amqpvalue_get_encoded_array_size(value_data->value.array_value.items, value_data->value.array_value.count, &array_size) != 0)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    result = encode_array_value(encoder_output, context, value_data->value.array_value.count, array_size, value_data->value.array_value.items, false);
                }
                break;
            }
        }
    }
    return result;
}